

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void read_global_config(char *config)

{
  ALLEGRO_CONFIG *cfg;
  
  cfg = (ALLEGRO_CONFIG *)al_load_config_file();
  if (cfg == (ALLEGRO_CONFIG *)0x0) {
    cfg = (ALLEGRO_CONFIG *)al_create_config();
  }
  fullscreen = get_config_int(cfg,"GFX","fullscreen",fullscreen);
  bit_depth = get_config_int(cfg,"GFX","bit_depth",bit_depth);
  screen_width = get_config_int(cfg,"GFX","screen_width",screen_width);
  screen_height = get_config_int(cfg,"GFX","screen_height",screen_height);
  window_width = get_config_int(cfg,"GFX","window_width",window_height);
  window_height = get_config_int(cfg,"GFX","window_height",screen_height);
  screen_samples = get_config_int(cfg,"GFX","samples",screen_samples);
  use_vsync = get_config_int(cfg,"GFX","vsync",use_vsync);
  logic_framerate = get_config_int(cfg,"TIMING","logic_framerate",logic_framerate);
  limit_framerate = get_config_int(cfg,"TIMING","limit_framerate",limit_framerate);
  max_frame_skip = get_config_int(cfg,"TIMING","max_frame_skip",max_frame_skip);
  display_framerate = get_config_int(cfg,"TIMING","display_framerate",display_framerate);
  reduce_cpu_usage = get_config_int(cfg,"TIMING","reduce_cpu_usage",reduce_cpu_usage);
  sound_volume = get_config_int(cfg,"SOUND","sound_volume",sound_volume);
  music_volume = get_config_int(cfg,"SOUND","music_volume",music_volume);
  set_sound_volume((double)sound_volume / 10.0);
  set_music_volume((double)music_volume / 10.0);
  controller_id = get_config_int(cfg,"CONTROLS","controller_id",controller_id);
  al_destroy_config(cfg);
  return;
}

Assistant:

void read_global_config(const char *config)
{
   ALLEGRO_CONFIG *c = al_load_config_file(config);
   if (!c) c = al_create_config();

   fullscreen = get_config_int(c, "GFX", "fullscreen", fullscreen);
   bit_depth = get_config_int(c, "GFX", "bit_depth", bit_depth);
   screen_width = get_config_int(c, "GFX", "screen_width", screen_width);
   screen_height = get_config_int(c, "GFX", "screen_height", screen_height);
   window_width = get_config_int(c, "GFX", "window_width", window_height);
   window_height = get_config_int(c, "GFX", "window_height", screen_height);
   screen_samples = get_config_int(c, "GFX", "samples", screen_samples);
   use_vsync = get_config_int(c, "GFX", "vsync", use_vsync);

   logic_framerate =
      get_config_int(c, "TIMING", "logic_framerate", logic_framerate);
   limit_framerate =
      get_config_int(c, "TIMING", "limit_framerate", limit_framerate);
   max_frame_skip =
      get_config_int(c, "TIMING", "max_frame_skip", max_frame_skip);
   display_framerate =
      get_config_int(c, "TIMING", "display_framerate", display_framerate);
   reduce_cpu_usage =
      get_config_int(c, "TIMING", "reduce_cpu_usage", reduce_cpu_usage);

   sound_volume = get_config_int(c, "SOUND", "sound_volume", sound_volume);
   music_volume = get_config_int(c, "SOUND", "music_volume", music_volume);
   
   set_sound_volume(sound_volume / 10.0);
   set_music_volume(music_volume / 10.0);

   controller_id = get_config_int(c, "CONTROLS", "controller_id", controller_id);
   
   al_destroy_config(c);
}